

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O2

float * CCEXP::getRow<float>(CCEXP *obj,char *matname,size_t row,size_t *cols)

{
  size_t sel;
  float *pfVar1;
  
  obj->ErrorId = 0;
  sel = CCEXP::getTableIndexByName(obj,matname);
  if (sel != 0xffffffffffffffff) {
    pfVar1 = getRow<float>(obj,sel,row,cols);
    return pfVar1;
  }
  CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",0x350,
                 "[%s]:: getRow():: Failed to find table with name [%s]!",obj->SavingFile,matname);
  return (float *)0x0;
}

Assistant:

inline T* getRow(
	CCEXP &obj, const char* matname, size_t row, size_t &cols
) {
	obj.ErrorId = 0;
	size_t sel = obj.getTableIndexByName(matname);
	CECS_ERRN(CCEXPECS,sel == MAXSIZE_T,"[%s]:: getRow():: Failed to find table with name [%s]!", obj.SavingFile, matname);
	T* vret = getRow<T>(obj, sel, row, cols);
	return vret;
}